

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::loop(Connection *this)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___00;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  *__return_storage_ptr___01;
  Connection *this_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params;
  OwnPromiseNode *next;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_00;
  ForkHub<kj::_::Void> *this_02;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_01;
  OwnPromiseNode *next_00;
  HttpInputStreamImpl *this_03;
  long lVar1;
  long *plVar2;
  undefined8 uVar3;
  PromiseArenaMember *pPVar4;
  SourceLocation location;
  bool bVar5;
  LoopResult LVar6;
  coroutine_handle<void> coroutine;
  undefined8 in_RSI;
  Connection *pCVar7;
  int iVar8;
  byte bVar9;
  
  coroutine._M_fr_ptr = operator_new(0x688);
  *(code **)coroutine._M_fr_ptr = loop;
  *(code **)((long)coroutine._M_fr_ptr + 8) = loop;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x670) = in_RSI;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00706898;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_007068e0;
  location.function = "loop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1d3c;
  location.columnNumber = 0x1b;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)((long)coroutine._M_fr_ptr + 0x238);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x430)
  ;
  __return_storage_ptr___01 =
       (OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
        *)((long)coroutine._M_fr_ptr + 0x5e8);
  this_01 = (Connection *)((long)coroutine._M_fr_ptr + 0x628);
  params = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)coroutine._M_fr_ptr + 0x630);
  next = (OwnPromiseNode *)((long)coroutine._M_fr_ptr + 0x638);
  params_00 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)coroutine._M_fr_ptr + 0x648)
  ;
  this_02 = (ForkHub<kj::_::Void> *)((long)coroutine._M_fr_ptr + 0x650);
  params_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)coroutine._M_fr_ptr + 0x658)
  ;
  next_00 = (OwnPromiseNode *)((long)coroutine._M_fr_ptr + 0x660);
  this_03 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x668);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00706898;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_007068e0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_Response)._vptr_Response = (_func_int **)this_00;
  bVar9 = 1;
  pCVar7 = this;
  do {
    *(int *)((long)coroutine._M_fr_ptr + 0x680) = (int)pCVar7;
    *(byte *)((long)coroutine._M_fr_ptr + 0x685) = bVar9;
    if (((((bVar9 & 1) == 0) &&
         (lVar1 = *(long *)((long)coroutine._M_fr_ptr + 0x670),
         *(char *)(*(long *)(lVar1 + 0x18) + 0x70) == '\x01')) && (*(long *)(lVar1 + 0x118) == 0))
       && ((anon_unknown_36::HttpInputStreamImpl::snarfBufferedLineBreak
                      ((HttpInputStreamImpl *)(lVar1 + 0x38)), *(char *)(lVar1 + 0x108) == '\0' &&
           (*(long *)(lVar1 + 0x78) == 0)))) {
      *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x678) =
           BREAK_LOOP_CONN_OK;
      kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                         ((long)coroutine._M_fr_ptr + 0x678));
      goto LAB_0045b3c1;
    }
    anon_unknown_36::HttpInputStreamImpl::awaitNextMessage(this_03);
    if ((bVar9 & 1) == 0) {
      lVar1 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x18);
      plVar2 = *(long **)(lVar1 + 8);
      (**(code **)(*plVar2 + 0x10))(next_00,plVar2,*(undefined8 *)(lVar1 + 0x38));
      lVar1 = *(long *)((long)coroutine._M_fr_ptr + 0x670);
      if (((*(long *)(lVar1 + 0x118) == 0) &&
          (anon_unknown_36::HttpInputStreamImpl::snarfBufferedLineBreak
                     ((HttpInputStreamImpl *)(lVar1 + 0x38)), *(char *)(lVar1 + 0x108) == '\0')) &&
         (*(long *)(lVar1 + 0x78) == 0)) {
        kj::_::ForkHub<kj::_::Void>::addBranch(this_02);
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x238) =
             *(undefined8 *)((long)coroutine._M_fr_ptr + 0x670);
        Promise<void>::then<kj::HttpServer::Connection::loop()::_lambda()_1_>
                  ((Promise<void> *)params_01,(anon_class_8_1_8991fb9c_for_func *)this_02);
        pPVar4 = (PromiseArenaMember *)
                 (this_02->super_ForkHubBase).super_PromiseArenaMember._vptr_PromiseArenaMember;
        if (pPVar4 != (PromiseArenaMember *)0x0) {
          (this_02->super_ForkHubBase).super_PromiseArenaMember._vptr_PromiseArenaMember =
               (_func_int **)0x0;
          kj::_::PromiseDisposer::dispose(pPVar4);
        }
        *(char **)((long)coroutine._M_fr_ptr + 0x238) =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
        ;
        *(char **)((long)coroutine._M_fr_ptr + 0x240) = "loop";
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x248) = 0x1c00001d69;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                  ((PromiseDisposer *)__return_storage_ptr___00,next_00,params_01,
                   (SourceLocation *)__return_storage_ptr__);
        uVar3 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430);
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
        pPVar4 = *(PromiseArenaMember **)((long)coroutine._M_fr_ptr + 0x660);
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x660) = uVar3;
        if (pPVar4 != (PromiseArenaMember *)0x0) {
          kj::_::PromiseDisposer::dispose(pPVar4);
        }
        pPVar4 = &params_01->ptr->super_PromiseArenaMember;
        if (pPVar4 != (PromiseArenaMember *)0x0) {
          params_01->ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar4);
        }
      }
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x640) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x670);
      *(code **)((long)coroutine._M_fr_ptr + 0x430) =
           kj::_::
           SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7532:65)>
           ::anon_class_8_1_8991fb9c_for_func::operator();
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<void,kj::HttpServer::Connection::loop()::_lambda()_2_>,kj::_::PromiseDisposer,kj::HttpServer::Connection::loop()::_lambda()_2_,void*&>
                ((PromiseDisposer *)__return_storage_ptr__,next_00,
                 (anon_class_8_1_8991fb9c_for_func *)((long)coroutine._M_fr_ptr + 0x640),
                 (void **)__return_storage_ptr___00);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x648) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x238);
      *(char **)((long)coroutine._M_fr_ptr + 0x238) =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      *(char **)((long)coroutine._M_fr_ptr + 0x240) = "loop";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x248) = 0x1500001d6c;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                ((PromiseDisposer *)__return_storage_ptr___00,(OwnPromiseNode *)this_03,params_00,
                 (SourceLocation *)__return_storage_ptr__);
      uVar3 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
      pPVar4 = *(PromiseArenaMember **)((long)coroutine._M_fr_ptr + 0x668);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x668) = uVar3;
      if (pPVar4 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(pPVar4);
      }
      pPVar4 = &params_00->ptr->super_PromiseArenaMember;
      if (pPVar4 != (PromiseArenaMember *)0x0) {
        params_00->ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar4);
      }
      pPVar4 = &next_00->ptr->super_PromiseArenaMember;
      if (pPVar4 != (PromiseArenaMember *)0x0) {
        next_00->ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar4);
      }
    }
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x238) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x670);
    *(byte *)((long)coroutine._M_fr_ptr + 0x240) = bVar9 & 1;
    Promise<bool>::then<kj::HttpServer::Connection::loop()::_lambda(bool)_1_>
              ((Promise<bool> *)next,(anon_class_16_2_14bf747a_for_func *)this_03);
    if ((bVar9 & 1) != 0) {
      lVar1 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x18);
      plVar2 = *(long **)(lVar1 + 8);
      (**(code **)(*plVar2 + 0x10))(__return_storage_ptr___00,plVar2,*(undefined8 *)(lVar1 + 0x30));
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x238) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x670);
      *(code **)((long)coroutine._M_fr_ptr + 0x628) =
           kj::_::
           SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7575:19)>
           ::anon_class_8_1_8991fb9c_for_func::operator();
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<void,kj::HttpServer::Connection::loop()::_lambda()_3_>,kj::_::PromiseDisposer,kj::HttpServer::Connection::loop()::_lambda()_3_,void*&>
                ((PromiseDisposer *)__return_storage_ptr___01,
                 (OwnPromiseNode *)__return_storage_ptr___00,
                 (anon_class_8_1_8991fb9c_for_func *)__return_storage_ptr__,(void **)this_01);
      pPVar4 = *(PromiseArenaMember **)((long)coroutine._M_fr_ptr + 0x430);
      uVar3 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x630) = uVar3;
      if (pPVar4 != (PromiseArenaMember *)0x0) {
        *(undefined8 *)&__return_storage_ptr___00->super_PromiseAwaiterBase = 0;
        kj::_::PromiseDisposer::dispose(pPVar4);
      }
      *(char **)((long)coroutine._M_fr_ptr + 0x238) =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      *(char **)((long)coroutine._M_fr_ptr + 0x240) = "loop";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x248) = 0x1b00001d9e;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                ((PromiseDisposer *)__return_storage_ptr___00,next,params,
                 (SourceLocation *)__return_storage_ptr__);
      uVar3 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
      pPVar4 = *(PromiseArenaMember **)((long)coroutine._M_fr_ptr + 0x638);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x638) = uVar3;
      if (pPVar4 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(pPVar4);
      }
      pPVar4 = &params->ptr->super_PromiseArenaMember;
      if (pPVar4 != (PromiseArenaMember *)0x0) {
        params->ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar4);
      }
    }
    co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr__,
               (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *)next);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x684) = 0;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar5) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume(__return_storage_ptr___01,__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 1000) == '\x01') {
      if (*(int *)((long)coroutine._M_fr_ptr + 0x3f0) == 1) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
      }
      if (*(int *)((long)coroutine._M_fr_ptr + 0x3f0) == 2) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
      }
      if (*(int *)((long)coroutine._M_fr_ptr + 0x3f0) == 3) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
      }
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    onHeaders(this_01,*(RequestConnectOrProtocolError **)((long)coroutine._M_fr_ptr + 0x670));
    co_await<kj::HttpServer::Connection::LoopResult>
              (__return_storage_ptr___00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_01)
    ;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x684) = 1;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (bVar5) {
      return (PromiseBase)(PromiseBase)this;
    }
    LVar6 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                      (__return_storage_ptr___00);
    pCVar7 = (Connection *)(ulong)LVar6;
    if (*(char *)((long)coroutine._M_fr_ptr + 0x448) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x450));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr___00);
    pPVar4 = (PromiseArenaMember *)(this_01->super_Response)._vptr_Response;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      (this_01->super_Response)._vptr_Response = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
    if (LVar6 - BREAK_LOOP_CONN_OK < 2) {
      *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x67c) =
           LVar6;
      kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                         ((long)coroutine._M_fr_ptr + 0x67c));
      bVar9 = *(byte *)((long)coroutine._M_fr_ptr + 0x685);
      iVar8 = 3;
    }
    else if (LVar6 == CONTINUE_LOOP) {
      bVar9 = 0;
      iVar8 = 0;
    }
    else {
      bVar9 = *(byte *)((long)coroutine._M_fr_ptr + 0x685);
      iVar8 = 0;
    }
    if (__return_storage_ptr___01->tag == 1) {
      __return_storage_ptr___01->tag = 0;
    }
    if (__return_storage_ptr___01->tag == 2) {
      __return_storage_ptr___01->tag = 0;
    }
    if (__return_storage_ptr___01->tag == 3) {
      __return_storage_ptr___01->tag = 0;
    }
    pPVar4 = &next->ptr->super_PromiseArenaMember;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      next->ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
    pPVar4 = (PromiseArenaMember *)(this_03->super_HttpInputStream)._vptr_HttpInputStream;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      (this_03->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
  } while (iVar8 == 0);
  if (iVar8 == 3) {
LAB_0045b3c1:
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x684) = 2;
  }
  else {
    if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true) {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
    }
    kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
    operator_delete(coroutine._M_fr_ptr,0x688);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> loop() {
    bool firstRequest = true;

    while (true) {
      if (!firstRequest && server.draining && httpInput.isCleanDrain()) {
        // Don't call awaitNextMessage() in this case because that will initiate a read() which will
        // immediately be canceled, losing data.
        co_return BREAK_LOOP_CONN_OK;
      }

      auto firstByte = httpInput.awaitNextMessage();

      if (!firstRequest) {
        // For requests after the first, require that the first byte arrive before the pipeline
        // timeout, otherwise treat it like the connection was simply closed.
        auto timeoutPromise = server.timer.afterDelay(server.settings.pipelineTimeout);

        if (httpInput.isCleanDrain()) {
          // If we haven't buffered any data, then we can safely drain here, so allow the wait to
          // be canceled by the onDrain promise.
          auto cleanDrainPromise = server.onDrain.addBranch()
              .then([this]() -> kj::Promise<void> {
            // This is a little tricky... drain() has been called, BUT we could have read some data
            // into the buffer in the meantime, and we don't want to lose that. If any data has
            // arrived, then we have no choice but to read the rest of the request and respond to
            // it.
            if (!httpInput.isCleanDrain()) {
              return kj::NEVER_DONE;
            }

            // OK... As far as we know, no data has arrived in the buffer. However, unfortunately,
            // we don't *really* know that, because read() is asynchronous. It may have already
            // delivered some bytes, but we just haven't received the notification yet, because it's
            // still queued on the event loop. As a horrible hack, we use evalLast(), so that any
            // such pending notifications get a chance to be delivered.
            // TODO(someday): Does this actually work on Windows, where the notification could also
            //   be queued on the IOCP?
            return kj::evalLast([this]() -> kj::Promise<void> {
              if (httpInput.isCleanDrain()) {
                return kj::READY_NOW;
              } else {
                return kj::NEVER_DONE;
              }
            });
          });
          timeoutPromise = timeoutPromise.exclusiveJoin(kj::mv(cleanDrainPromise));
        }

        firstByte = firstByte.exclusiveJoin(timeoutPromise.then([this]() -> bool {
          timedOut = true;
          return false;
        }));
      }

      auto receivedHeaders = firstByte
          .then([this,firstRequest](bool hasData)
              -> kj::Promise<HttpHeaders::RequestConnectOrProtocolError> {
        if (hasData) {
          auto readHeaders = httpInput.readRequestHeaders();
          if (!firstRequest) {
            // On requests other than the first, the header timeout starts ticking when we receive
            // the first byte of a pipeline response.
            readHeaders = readHeaders.exclusiveJoin(
                server.timer.afterDelay(server.settings.headerTimeout)
                .then([this]() -> HttpHeaders::RequestConnectOrProtocolError {
              timedOut = true;
              return HttpHeaders::ProtocolError {
                408, "Request Timeout",
                "Timed out waiting for next request headers.", nullptr
              };
            }));
          }
          return kj::mv(readHeaders);
        } else {
          // Client closed connection or pipeline timed out with no bytes received. This is not an
          // error, so don't report one.
          this->closed = true;
          return HttpHeaders::RequestConnectOrProtocolError(HttpHeaders::ProtocolError {
            408, "Request Timeout",
            "Client closed connection or connection timeout "
            "while waiting for request headers.", nullptr
          });
        }
      });

      if (firstRequest) {
        // On the first request, the header timeout starts ticking immediately upon request opening.
        // NOTE: Since we assume that the client wouldn't have formed a connection if they did not
        //   intend to send a request, we immediately treat this connection as having an active
        //   request, i.e. we do NOT cancel it if drain() is called.
        auto timeoutPromise = server.timer.afterDelay(server.settings.headerTimeout)
            .then([this]() -> HttpHeaders::RequestConnectOrProtocolError {
          timedOut = true;
          return HttpHeaders::ProtocolError {
            408, "Request Timeout",
            "Timed out waiting for initial request headers.", nullptr
          };
        });
        receivedHeaders = receivedHeaders.exclusiveJoin(kj::mv(timeoutPromise));
      }

      auto requestOrProtocolError = co_await receivedHeaders;
      auto loopResult = co_await onHeaders(kj::mv(requestOrProtocolError));

      switch (loopResult) {
        case BREAK_LOOP_CONN_ERR:
        case BREAK_LOOP_CONN_OK: co_return loopResult;
        case CONTINUE_LOOP: {
          firstRequest = false;
        }
      }
    }
  }